

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(uint64_t *output,uint64_t *t1)

{
  fe_t_conflict2 t3;
  fe_t_conflict2 t13;
  fe_t_conflict2 acc;
  int i;
  uint64_t *in_stack_00001218;
  uint64_t *in_stack_00001220;
  uint64_t *in_stack_00001228;
  uint64_t *in_stack_00001230;
  undefined4 local_14;
  
  fiat_id_tc26_gost_3410_2012_512_paramSetB_square(in_stack_00001220,in_stack_00001218);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001230,in_stack_00001228,in_stack_00001220);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001230,in_stack_00001228,in_stack_00001220);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
              (in_stack_00001230,in_stack_00001228,in_stack_00001220);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetB_square(in_stack_00001220,in_stack_00001218);
  for (local_14 = 0; local_14 < 0x1f9; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(in_stack_00001220,in_stack_00001218);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001230,in_stack_00001228,in_stack_00001220);
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(in_stack_00001220,in_stack_00001218);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001230,in_stack_00001228,in_stack_00001220);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(fe_t output,
                                                          const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t13, t3;

    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t3, t1, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t13, t3, acc);
    for (i = 0; i < 4; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t13, t13, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, t1);
    for (i = 0; i < 505; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(acc, acc, t3);
    for (i = 0; i < 5; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(output, acc, t13);
}